

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall wabt::WastLexer::GetIdToken(Token *__return_storage_ptr__,WastLexer *this)

{
  bool bVar1;
  
  if (this->cursor_ < this->buffer_end_) {
    this->cursor_ = this->cursor_ + 1;
  }
  bVar1 = NoTrailingReservedChars(this);
  TextToken(__return_storage_ptr__,this,(uint)!bVar1 * 2 + Reserved,0);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetIdToken() {
  ReadChar();
  if (NoTrailingReservedChars()) {
    return TextToken(TokenType::Reserved);
  }
  return TextToken(TokenType::Var);
}